

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mtcrf(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  int iVar2;
  uint32_t uVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 temp_1;
  TCGv_i32 temp;
  uint32_t crn;
  uint32_t crm;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = CRM(ctx->opcode);
  if ((ctx->opcode & 0x100000) == 0) {
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    uVar3 = rS(ctx->opcode);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,pTVar4,cpu_gpr[uVar3]);
    for (temp._0_4_ = 0; (uint)temp < 8; temp._0_4_ = (uint)temp + 1) {
      if ((uVar1 & 1 << ((byte)(uint)temp & 0x1f)) != 0) {
        tcg_gen_shri_i32_ppc64(tcg_ctx_00,cpu_crf[7 - (uint)temp],pTVar4,(uint)temp << 2);
        tcg_gen_andi_i32_ppc64(tcg_ctx_00,cpu_crf[7 - (uint)temp],cpu_crf[7 - (uint)temp],0xf);
      }
    }
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
  }
  else if ((uVar1 != 0) && ((uVar1 & uVar1 - 1) == 0)) {
    pTVar4 = tcg_temp_new_i32(tcg_ctx_00);
    iVar2 = ctz32(uVar1);
    uVar1 = rS(ctx->opcode);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx_00,pTVar4,cpu_gpr[uVar1]);
    tcg_gen_shri_i32_ppc64(tcg_ctx_00,pTVar4,pTVar4,iVar2 << 2);
    tcg_gen_andi_i32_ppc64(tcg_ctx_00,cpu_crf[7 - iVar2],pTVar4,0xf);
    tcg_temp_free_i32(tcg_ctx_00,pTVar4);
  }
  return;
}

Assistant:

static void gen_mtcrf(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t crm, crn;

    crm = CRM(ctx->opcode);
    if (likely((ctx->opcode & 0x00100000))) {
        if (crm && ((crm & (crm - 1)) == 0)) {
            TCGv_i32 temp = tcg_temp_new_i32(tcg_ctx);
            crn = ctz32(crm);
            tcg_gen_trunc_tl_i32(tcg_ctx, temp, cpu_gpr[rS(ctx->opcode)]);
            tcg_gen_shri_i32(tcg_ctx, temp, temp, crn * 4);
            tcg_gen_andi_i32(tcg_ctx, cpu_crf[7 - crn], temp, 0xf);
            tcg_temp_free_i32(tcg_ctx, temp);
        }
    } else {
        TCGv_i32 temp = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_trunc_tl_i32(tcg_ctx, temp, cpu_gpr[rS(ctx->opcode)]);
        for (crn = 0 ; crn < 8 ; crn++) {
            if (crm & (1 << crn)) {
                    tcg_gen_shri_i32(tcg_ctx, cpu_crf[7 - crn], temp, crn * 4);
                    tcg_gen_andi_i32(tcg_ctx, cpu_crf[7 - crn], cpu_crf[7 - crn], 0xf);
            }
        }
        tcg_temp_free_i32(tcg_ctx, temp);
    }
}